

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O3

Parameters * __thiscall cnn::Model::add_parameters(Model *this,Dim *d,float scale)

{
  pointer *pppPVar1;
  pointer *pppPVar2;
  iterator __position;
  iterator __position_00;
  Parameters *this_00;
  Parameters *p;
  Parameters *local_28;
  Parameters *local_20;
  
  this_00 = (Parameters *)operator_new(0xc0);
  Parameters::Parameters(this_00,d,scale);
  __position._M_current =
       (this->all_params).
       super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_20 = this_00;
  local_28 = this_00;
  if (__position._M_current ==
      (this->all_params).
      super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cnn::ParametersBase*,std::allocator<cnn::ParametersBase*>>::
    _M_realloc_insert<cnn::ParametersBase*>
              ((vector<cnn::ParametersBase*,std::allocator<cnn::ParametersBase*>> *)this,__position,
               (ParametersBase **)&local_28);
  }
  else {
    *__position._M_current = (ParametersBase *)this_00;
    pppPVar1 = &(this->all_params).
                super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppPVar1 = *pppPVar1 + 1;
  }
  __position_00._M_current =
       (this->params).super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (this->params).super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<cnn::Parameters*,std::allocator<cnn::Parameters*>>::
    _M_realloc_insert<cnn::Parameters*const&>
              ((vector<cnn::Parameters*,std::allocator<cnn::Parameters*>> *)&this->params,
               __position_00,&local_20);
  }
  else {
    *__position_00._M_current = this_00;
    pppPVar2 = &(this->params).
                super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppPVar2 = *pppPVar2 + 1;
    local_20 = this_00;
  }
  return local_20;
}

Assistant:

Parameters* Model::add_parameters(const Dim& d, float scale) {
  Parameters* p = new Parameters(d, scale);
  all_params.push_back(p);
  params.push_back(p);
  return p;
}